

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O3

void __thiscall
icu_63::RuleBasedNumberFormat::initCapitalizationContextInfo
          (RuleBasedNumberFormat *this,Locale *thelocale)

{
  UBool UVar1;
  char *localeID;
  UResourceBundle *pUVar2;
  int32_t *piVar3;
  int32_t len;
  UErrorCode status;
  int32_t local_fc;
  Locale local_f8;
  
  Locale::Locale(&local_f8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  UVar1 = Locale::operator==(thelocale,&local_f8);
  if (UVar1 == '\0') {
    localeID = Locale::getBaseName(thelocale);
  }
  else {
    localeID = (char *)0x0;
  }
  Locale::~Locale(&local_f8);
  local_f8.super_UObject._vptr_UObject._0_4_ = 0;
  pUVar2 = ures_open_63((char *)0x0,localeID,(UErrorCode *)&local_f8);
  pUVar2 = ures_getByKeyWithFallback_63(pUVar2,"contextTransforms",pUVar2,(UErrorCode *)&local_f8);
  pUVar2 = ures_getByKeyWithFallback_63(pUVar2,"number-spellout",pUVar2,(UErrorCode *)&local_f8);
  if (((int)local_f8.super_UObject._vptr_UObject < 1) && (pUVar2 != (UResourceBundle *)0x0)) {
    local_fc = 0;
    piVar3 = ures_getIntVector_63(pUVar2,&local_fc,(UErrorCode *)&local_f8);
    if (((int)local_f8.super_UObject._vptr_UObject < 1) &&
       ((piVar3 != (int32_t *)0x0 && (1 < local_fc)))) {
      this->capitalizationForUIListMenu = (UBool)*piVar3;
      this->capitalizationForStandAlone = (UBool)piVar3[1];
    }
  }
  ures_close_63(pUVar2);
  return;
}

Assistant:

void
RuleBasedNumberFormat::initCapitalizationContextInfo(const Locale& thelocale)
{
#if !UCONFIG_NO_BREAK_ITERATION
    const char * localeID = (thelocale != NULL)? thelocale.getBaseName(): NULL;
    UErrorCode status = U_ZERO_ERROR;
    UResourceBundle *rb = ures_open(NULL, localeID, &status);
    rb = ures_getByKeyWithFallback(rb, "contextTransforms", rb, &status);
    rb = ures_getByKeyWithFallback(rb, "number-spellout", rb, &status);
    if (U_SUCCESS(status) && rb != NULL) {
        int32_t len = 0;
        const int32_t * intVector = ures_getIntVector(rb, &len, &status);
        if (U_SUCCESS(status) && intVector != NULL && len >= 2) {
            capitalizationForUIListMenu = static_cast<UBool>(intVector[0]);
            capitalizationForStandAlone = static_cast<UBool>(intVector[1]);
        }
    }
    ures_close(rb);
#endif
}